

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BarrierCase::init(BarrierCase *this,EVP_PKEY_CTX *ctx)

{
  Context *this_00;
  RenderContext *renderCtx;
  int iVar1;
  RenderTarget *renderTarget;
  ShaderProgram *this_01;
  ProgramSources *pPVar2;
  TestError *this_02;
  char *in_RCX;
  TessPrimitiveType primType;
  undefined1 local_2d0 [40];
  undefined1 local_2a8 [40];
  undefined1 local_280 [40];
  undefined1 local_258 [40];
  SharedPtr<const_glu::ShaderProgram> local_230;
  string fragmentShaderTemplate;
  string numVertsStr;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  ProgramSources local_100;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  de::toString<int>(&numVertsStr,&(anonymous_namespace)::BarrierCase::NUM_VERTICES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexShaderTemplate,
             "${GLSL_VERSION_DECL}\n\nin highp float in_v_attr;\n\nout highp float in_tc_attr;\n\nvoid main (void)\n{\n\tin_tc_attr = in_v_attr;\n}\n"
             ,(allocator<char> *)&local_100);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = ",
                 &numVertsStr);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                 ") out;\n\nin highp float in_tc_attr[];\n\nout highp float in_te_attr[];\npatch out highp float in_te_patchAttr;\n\nvoid main (void)\n{\n\tin_te_attr[gl_InvocationID] = in_tc_attr[gl_InvocationID];\n\tin_te_patchAttr = 0.0f;\n\tbarrier();\n\tif (gl_InvocationID == 5)\n\t\tin_te_patchAttr = float(gl_InvocationID)*0.1;\n\tbarrier();\n\thighp float temp = in_te_patchAttr + in_te_attr[gl_InvocationID];\n\tbarrier();\n\tif (gl_InvocationID == "
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                 &numVertsStr);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                 "-1)\n\t\tin_te_patchAttr = float(gl_InvocationID);\n\tbarrier();\n\tin_te_attr[gl_InvocationID] = temp;\n\tbarrier();\n\ttemp = temp + in_te_attr[(gl_InvocationID+1) % "
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 &numVertsStr);
  std::operator+(&tessellationControlTemplate,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 "];\n\tbarrier();\n\tin_te_attr[gl_InvocationID] = 0.25*temp;\n\n\tgl_TessLevelInner[0] = 32.0;\n\tgl_TessLevelInner[1] = 32.0;\n\n\tgl_TessLevelOuter[0] = 32.0;\n\tgl_TessLevelOuter[1] = 32.0;\n\tgl_TessLevelOuter[2] = 32.0;\n\tgl_TessLevelOuter[3] = 32.0;\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)local_280);
  std::__cxx11::string::~string((string *)local_2a8);
  std::__cxx11::string::~string((string *)local_2d0);
  (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            (&fragmentShaderTemplate,(_anonymous_namespace_ *)0x1,primType,SUB81(in_RCX,0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",&fragmentShaderTemplate)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                 "\nin highp float in_te_attr[];\npatch in highp float in_te_patchAttr;\n\nout highp float in_f_blue;\n\nvoid main (void)\n{\n\thighp float x = gl_TessCoord.x*2.0 - 1.0;\n\thighp float y = gl_TessCoord.y - in_te_attr[int(round(gl_TessCoord.x*float("
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                 &numVertsStr);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                 "-1)))];\n\tgl_Position = vec4(x, y, 0.0, 1.0);\n\tin_f_blue = abs(in_te_patchAttr - float("
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 &numVertsStr);
  std::operator+(&tessellationEvaluationTemplate,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 "-1));\n}\n");
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string((string *)local_280);
  std::__cxx11::string::~string((string *)local_2a8);
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragmentShaderTemplate,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp float in_f_blue;\n\nvoid main (void)\n{\n\to_color = vec4(1.0, 0.0, in_f_blue, 1.0);\n}\n"
             ,(allocator<char> *)&local_100);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  this_00 = (this->super_TestCase).m_context;
  renderCtx = this_00->m_renderCtx;
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_180,(_anonymous_namespace_ *)this_00,
             (Context *)vertexShaderTemplate._M_dataplus._M_p,in_RCX);
  glu::VertexSource::VertexSource((VertexSource *)local_258,&local_180);
  pPVar2 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_258);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1a0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)tessellationControlTemplate._M_dataplus._M_p,in_RCX);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_280,&local_1a0);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_280);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1c0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)tessellationEvaluationTemplate._M_dataplus._M_p,in_RCX);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_2a8,&local_1c0);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_2a8);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1e0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)fragmentShaderTemplate._M_dataplus._M_p,in_RCX);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_2d0,&local_1e0);
  pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_2d0);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,pPVar2);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_230,this_01);
  de::SharedPtr<const_glu::ShaderProgram>::operator=(&this->m_program,&local_230);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_230);
  std::__cxx11::string::~string((string *)(local_2d0 + 8));
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)(local_2a8 + 8));
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)(local_280 + 8));
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)(local_258 + 8));
  std::__cxx11::string::~string((string *)&local_180);
  glu::ProgramSources::~ProgramSources(&local_100);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
    std::__cxx11::string::~string((string *)&tessellationEvaluationTemplate);
    std::__cxx11::string::~string((string *)&tessellationControlTemplate);
    std::__cxx11::string::~string((string *)&vertexShaderTemplate);
    iVar1 = std::__cxx11::string::~string((string *)&numVertsStr);
    return iVar1;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0xd7b);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BarrierCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	const string numVertsStr = de::toString(NUM_VERTICES);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp float in_v_attr;\n"
													 "\n"
													 "out highp float in_tc_attr;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_tc_attr = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 "layout (vertices = " + numVertsStr + ") out;\n"
													 "\n"
													 "in highp float in_tc_attr[];\n"
													 "\n"
													 "out highp float in_te_attr[];\n"
													 "patch out highp float in_te_patchAttr;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_te_attr[gl_InvocationID] = in_tc_attr[gl_InvocationID];\n"
													 "	in_te_patchAttr = 0.0f;\n"
													 "	barrier();\n"
													 "	if (gl_InvocationID == 5)\n"
													 "		in_te_patchAttr = float(gl_InvocationID)*0.1;\n"
													 "	barrier();\n"
													 "	highp float temp = in_te_patchAttr + in_te_attr[gl_InvocationID];\n"
													 "	barrier();\n"
													 "	if (gl_InvocationID == " + numVertsStr + "-1)\n"
													 "		in_te_patchAttr = float(gl_InvocationID);\n"
													 "	barrier();\n"
													 "	in_te_attr[gl_InvocationID] = temp;\n"
													 "	barrier();\n"
													 "	temp = temp + in_te_attr[(gl_InvocationID+1) % " + numVertsStr + "];\n"
													 "	barrier();\n"
													 "	in_te_attr[gl_InvocationID] = 0.25*temp;\n"
													 "\n"
													 "	gl_TessLevelInner[0] = 32.0;\n"
													 "	gl_TessLevelInner[1] = 32.0;\n"
													 "\n"
													 "	gl_TessLevelOuter[0] = 32.0;\n"
													 "	gl_TessLevelOuter[1] = 32.0;\n"
													 "	gl_TessLevelOuter[2] = 32.0;\n"
													 "	gl_TessLevelOuter[3] = 32.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(TESSPRIMITIVETYPE_QUADS) +
													 "\n"
													 "in highp float in_te_attr[];\n"
													 "patch in highp float in_te_patchAttr;\n"
													 "\n"
													 "out highp float in_f_blue;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	highp float x = gl_TessCoord.x*2.0 - 1.0;\n"
													 "	highp float y = gl_TessCoord.y - in_te_attr[int(round(gl_TessCoord.x*float(" + numVertsStr + "-1)))];\n"
													 "	gl_Position = vec4(x, y, 0.0, 1.0);\n"
													 "	in_f_blue = abs(in_te_patchAttr - float(" + numVertsStr + "-1));\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in highp float in_f_blue;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = vec4(1.0, 0.0, in_f_blue, 1.0);\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}